

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSphereShape.cpp
# Opt level: O1

void __thiscall
btMultiSphereShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btMultiSphereShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  btVector3 *pbVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  long lVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  float *pfVar17;
  uint uVar18;
  btVector3 *pbVar19;
  float extraout_XMM0_Da;
  float fVar20;
  float fVar21;
  float fVar22;
  btVector3 temp [128];
  ulong local_8a8;
  float local_838 [2];
  undefined8 local_830 [256];
  
  if (0 < numVectors) {
    local_8a8 = 0;
    do {
      iVar7 = (this->m_localPositionArray).m_size;
      uVar14 = (ulong)iVar7;
      if (0 < (long)uVar14) {
        pbVar1 = vectors + local_8a8;
        pbVar19 = (this->m_localPositionArray).m_data;
        pfVar17 = (this->m_radiArray).m_data;
        iVar15 = 0;
        fVar22 = -1e+18;
        do {
          uVar16 = 0x80;
          if ((long)uVar14 < 0x80) {
            uVar16 = uVar14;
          }
          uVar18 = 0x80;
          if ((int)(uint)uVar14 < 0x80) {
            uVar18 = (uint)uVar14;
          }
          if ((int)uVar18 < 2) {
            uVar18 = 1;
          }
          if (iVar15 < iVar7) {
            lVar10 = 0;
            do {
              lVar13 = lVar10;
              fVar20 = pbVar1->m_floats[2];
              fVar21 = *(float *)&(this->super_btConvexInternalAabbCachingShape).
                                  super_btConvexInternalShape.field_0x24;
              fVar2 = *pfVar17;
              fVar3 = *(float *)((long)pbVar19->m_floats + lVar13 + 8);
              uVar4 = *(undefined8 *)pbVar1->m_floats;
              uVar5 = *(undefined8 *)
                       &(this->super_btConvexInternalAabbCachingShape).super_btConvexInternalShape.
                        super_btConvexShape.super_btCollisionShape.field_0x1c;
              uVar6 = *(undefined8 *)((long)pbVar19->m_floats + lVar13);
              (*(this->super_btConvexInternalAabbCachingShape).super_btConvexInternalShape.
                super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
              auVar8._4_4_ = ((float)((ulong)uVar6 >> 0x20) +
                             fVar2 * (float)((ulong)uVar5 >> 0x20) * (float)((ulong)uVar4 >> 0x20))
                             - extraout_XMM0_Da *
                               (float)((ulong)*(undefined8 *)pbVar1->m_floats >> 0x20);
              auVar8._0_4_ = ((float)uVar6 + fVar2 * (float)uVar5 * (float)uVar4) -
                             extraout_XMM0_Da * (float)*(undefined8 *)pbVar1->m_floats;
              auVar8._8_4_ = (fVar20 * fVar21 * fVar2 + fVar3) -
                             extraout_XMM0_Da * pbVar1->m_floats[2];
              auVar8._12_4_ = 0;
              *(undefined1 (*) [16])((long)local_838 + lVar13) = auVar8;
              pfVar17 = pfVar17 + 1;
              lVar10 = lVar13 + 0x10;
            } while ((ulong)uVar18 * 0x10 != lVar13 + 0x10);
            pbVar19 = (btVector3 *)((long)pbVar19[1].m_floats + lVar13);
          }
          if (iVar7 - iVar15 < 1) {
            lVar10 = -1;
            fVar20 = -3.4028235e+38;
          }
          else {
            uVar9 = 0xffffffff;
            pfVar11 = (float *)local_830;
            uVar12 = 0;
            fVar20 = -3.4028235e+38;
            do {
              fVar21 = *pfVar11 * pbVar1->m_floats[2] +
                       pfVar11[-2] * pbVar1->m_floats[0] + pfVar11[-1] * pbVar1->m_floats[1];
              if (fVar20 < fVar21) {
                uVar9 = uVar12 & 0xffffffff;
                fVar20 = fVar21;
              }
              uVar12 = uVar12 + 1;
              pfVar11 = pfVar11 + 4;
            } while (uVar16 != uVar12);
            lVar10 = (long)(int)uVar9;
          }
          if (fVar22 < fVar20) {
            uVar4 = local_830[lVar10 * 2];
            *(undefined8 *)supportVerticesOut[local_8a8].m_floats =
                 *(undefined8 *)(local_838 + lVar10 * 4);
            *(undefined8 *)(supportVerticesOut[local_8a8].m_floats + 2) = uVar4;
            fVar22 = fVar20;
          }
          iVar15 = iVar15 + 0x80;
          uVar14 = uVar14 - 0x80;
        } while (iVar15 < iVar7);
      }
      local_8a8 = local_8a8 + 1;
    } while (local_8a8 != (uint)numVectors);
  }
  return;
}

Assistant:

void	btMultiSphereShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{

	for (int j=0;j<numVectors;j++)
	{
		btScalar maxDot(btScalar(-BT_LARGE_FLOAT));

		const btVector3& vec = vectors[j];

		btVector3 vtx;
		btScalar newDot;

		const btVector3* pos = &m_localPositionArray[0];
		const btScalar* rad = &m_radiArray[0];
		int numSpheres = m_localPositionArray.size();

        for( int k = 0; k < numSpheres; k+= 128 )
        {
            btVector3 temp[128];
            int inner_count = MIN( numSpheres - k, 128 );
            for( long i = 0; i < inner_count; i++ )
            {
                temp[i] = (*pos) +vec*m_localScaling*(*rad) - vec * getMargin();
                pos++;
                rad++;
            }
            long i = vec.maxDot( temp, inner_count, newDot);
            if( newDot > maxDot )
            {
                maxDot = newDot;
                supportVerticesOut[j] = temp[i];
            }
        }
        
	}
}